

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  bool bVar1;
  uint uVar2;
  Token *pTVar3;
  element_type *peVar4;
  ParseResultType *pPVar5;
  TokenStream *remainingTokens_00;
  ParseState local_260;
  ParseState local_230;
  ParseState local_200;
  undefined1 local_1d0 [8];
  ParserResult result_1;
  Token local_180;
  Token *local_158;
  Token *argToken;
  element_type *local_130;
  BoundValueRefBase *valueRef;
  undefined1 local_f8 [8];
  ParserResult result;
  BoundFlagRefBase *flagRef;
  string sStack_b8;
  BoundFlagRefBase **local_98;
  Token *token;
  TokenStream remainingTokens;
  undefined1 local_58 [8];
  Result validationResult;
  TokenStream *tokens_local;
  string *param_1_local;
  Opt *this_local;
  
  validationResult.m_errorMessage.field_2._8_8_ = tokens;
  (*(this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
    super_ParserBase._vptr_ParserBase[2])();
  bVar1 = Detail::BasicResult::operator_cast_to_bool((BasicResult *)local_58);
  if (!bVar1) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,(BasicResult<void> *)local_58);
    remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_002aa367;
  }
  Detail::TokenStream::TokenStream
            ((TokenStream *)&token,(TokenStream *)validationResult.m_errorMessage.field_2._8_8_);
  bVar1 = Detail::TokenStream::operator_cast_to_bool((TokenStream *)&token);
  if ((bVar1) &&
     (pTVar3 = Detail::TokenStream::operator->((TokenStream *)&token), pTVar3->type == Option)) {
    Detail::TokenStream::operator*((Token *)&flagRef,(TokenStream *)&token);
    local_98 = &flagRef;
    bVar1 = isMatch(this,&sStack_b8);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref);
      uVar2 = (*peVar4->_vptr_BoundRef[3])();
      if ((uVar2 & 1) == 0) {
        local_130 = std::__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::
                    get(&(this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
                         super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                       );
        Detail::TokenStream::operator++((TokenStream *)&token);
        bVar1 = Detail::TokenStream::operator_cast_to_bool((TokenStream *)&token);
        if (!bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &argToken,"Expected argument following ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_98 + 1));
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                    (__return_storage_ptr__,(string *)&argToken);
          std::__cxx11::string::~string((string *)&argToken);
          remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          goto LAB_002aa2c8;
        }
        Detail::TokenStream::operator*(&local_180,(TokenStream *)&token);
        local_158 = &local_180;
        if (local_180.type == Argument) {
          (*local_130->_vptr_BoundRef[4])(local_1d0,local_130,&local_180.token);
          bVar1 = Detail::BasicResult::operator_cast_to_bool((BasicResult *)local_1d0);
          if (bVar1) {
            pPVar5 = Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                               ((ResultValueBase<Catch::Clara::ParseResultType> *)local_1d0);
            if (*pPVar5 == ShortCircuitAll) {
              pPVar5 = Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                                 ((ResultValueBase<Catch::Clara::ParseResultType> *)local_1d0);
              Detail::ParseState::ParseState(&local_200,*pPVar5,(TokenStream *)&token);
              Detail::BasicResult<Catch::Clara::Detail::ParseState>::
              ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,&local_200);
              Detail::ParseState::~ParseState(&local_200);
              remainingTokens.m_tokenBuffer.
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
            else {
              remainingTokens.m_tokenBuffer.
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            }
          }
          else {
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            BasicResult<Catch::Clara::ParseResultType>
                      (__return_storage_ptr__,
                       (BasicResult<Catch::Clara::ParseResultType> *)local_1d0);
            remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult
                    ((BasicResult<Catch::Clara::ParseResultType> *)local_1d0);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&result_1.m_errorMessage.field_2 + 8),"Expected argument following "
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_98 + 1));
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                    (__return_storage_ptr__,(string *)((long)&result_1.m_errorMessage.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)(result_1.m_errorMessage.field_2._M_local_buf + 8));
          remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        Detail::Token::~Token(&local_180);
      }
      else {
        result.m_errorMessage.field_2._8_8_ =
             std::__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
                         super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                       );
        (*((element_type *)result.m_errorMessage.field_2._8_8_)->_vptr_BoundRef[4])
                  (local_f8,result.m_errorMessage.field_2._8_8_,1);
        bVar1 = Detail::BasicResult::operator_cast_to_bool((BasicResult *)local_f8);
        if (bVar1) {
          pPVar5 = Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                             ((ResultValueBase<Catch::Clara::ParseResultType> *)local_f8);
          if (*pPVar5 == ShortCircuitAll) {
            pPVar5 = Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                               ((ResultValueBase<Catch::Clara::ParseResultType> *)local_f8);
            Detail::ParseState::ParseState((ParseState *)&valueRef,*pPVar5,(TokenStream *)&token);
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,(ParseState *)&valueRef);
            Detail::ParseState::~ParseState((ParseState *)&valueRef);
            remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          else {
            remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
        }
        else {
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          BasicResult<Catch::Clara::ParseResultType>
                    (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_f8);
          remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult
                  ((BasicResult<Catch::Clara::ParseResultType> *)local_f8);
      }
      if ((int)remainingTokens.m_tokenBuffer.
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        remainingTokens_00 = Detail::TokenStream::operator++((TokenStream *)&token);
        Detail::ParseState::ParseState(&local_230,Matched,remainingTokens_00);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (__return_storage_ptr__,&local_230);
        Detail::ParseState::~ParseState(&local_230);
        remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
LAB_002aa2c8:
    Detail::Token::~Token((Token *)&flagRef);
    if ((int)remainingTokens.m_tokenBuffer.
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_002aa2ed;
  }
  else {
LAB_002aa2ed:
    Detail::ParseState::ParseState(&local_260,NoMatch,(TokenStream *)&token);
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
              (__return_storage_ptr__,&local_260);
    Detail::ParseState::~ParseState(&local_260);
    remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  Detail::TokenStream::~TokenStream((TokenStream *)&token);
LAB_002aa367:
  Detail::BasicResult<void>::~BasicResult((BasicResult<void> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const &,
            Detail::TokenStream const &tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto remainingTokens = tokens;
            if (remainingTokens &&
                remainingTokens->type == Detail::TokenType::Option) {
                auto const &token = *remainingTokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase *>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), remainingTokens));
                    }
                    else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase *>(
                                m_ref.get());
                        ++remainingTokens;
                        if (!remainingTokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const &argToken = *remainingTokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto result = valueRef->setValue(argToken.token);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), remainingTokens));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, ++remainingTokens));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, remainingTokens));
        }